

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpr<std::basic_ostream<char,_std::char_traits<char>_>_*const_&,_std::basic_ostream<char,_std::char_traits<char>_>_*const_&>
::streamReconstructedExpression
          (BinaryExpr<std::basic_ostream<char,_std::char_traits<char>_>_*const_&,_std::basic_ostream<char,_std::char_traits<char>_>_*const_&>
           *this,ostream *os)

{
  basic_ostream<char,_std::char_traits<char>_> **in_RDX;
  basic_ostream<char,_std::char_traits<char>_> **e;
  string *in_R9;
  StringRef op;
  string local_68;
  string *local_48;
  char *pcStack_40;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  BinaryExpr<std::basic_ostream<char,_std::char_traits<char>_>_*const_&,_std::basic_ostream<char,_std::char_traits<char>_>_*const_&>
  *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<std::ostream*>(&local_38,(Detail *)this->m_lhs,in_RDX);
  local_48 = (string *)(this->m_op).m_start;
  pcStack_40 = (char *)(this->m_op).m_size;
  Detail::stringify<std::ostream*>(&local_68,(Detail *)this->m_rhs,e);
  op.m_size = (size_type)&local_68;
  op.m_start = pcStack_40;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_38,local_48,op,in_R9);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }